

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::ParseFile(SMDImporter *this)

{
  bool bVar1;
  uint uVar2;
  Logger *this_00;
  char *local_18;
  char *szCurrent;
  SMDImporter *this_local;
  
  szCurrent = (char *)this;
  local_18 = std::vector<char,_std::allocator<char>_>::operator[](&this->mBuffer,0);
  while( true ) {
    while( true ) {
      bVar1 = SkipSpacesAndLineEnd(this,local_18,&local_18);
      if (!bVar1) {
        return;
      }
      bVar1 = TokenMatch<char_const>(&local_18,"version",7);
      if (bVar1) break;
      bVar1 = TokenMatch<char_const>(&local_18,"nodes",5);
      if (bVar1) {
        ParseNodesSection(this,local_18,&local_18);
      }
      else {
        bVar1 = TokenMatch<char_const>(&local_18,"triangles",9);
        if (bVar1) {
          ParseTrianglesSection(this,local_18,&local_18);
        }
        else {
          bVar1 = TokenMatch<char_const>(&local_18,"vertexanimation",0xf);
          if (bVar1) {
            this->bHasUVs = false;
            ParseVASection(this,local_18,&local_18);
          }
          else {
            bVar1 = TokenMatch<char_const>(&local_18,"skeleton",8);
            if (bVar1) {
              ParseSkeletonSection(this,local_18,&local_18);
            }
            else {
              SkipLine(this,local_18,&local_18);
            }
          }
        }
      }
    }
    bVar1 = SkipSpaces<char>(local_18,&local_18);
    if (!bVar1) break;
    uVar2 = strtoul10(local_18,&local_18);
    if (uVar2 != 1) {
      this_00 = DefaultLogger::get();
      Logger::warn(this_00,
                   "SMD.version is not 1. This file format is not known. Continuing happily ...");
    }
  }
  return;
}

Assistant:

void SMDImporter::ParseFile() {
    const char* szCurrent = &mBuffer[0];

    // read line per line ...
    for ( ;; ) {
        if(!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "version <n> \n", <n> should be 1 for hl and hl2 SMD files
        if (TokenMatch(szCurrent,"version",7)) {
            if(!SkipSpaces(szCurrent,&szCurrent)) break;
            if (1 != strtoul10(szCurrent,&szCurrent)) {
                ASSIMP_LOG_WARN("SMD.version is not 1. This "
                    "file format is not known. Continuing happily ...");
            }
            continue;
        }
        // "nodes\n" - Starts the node section
        if (TokenMatch(szCurrent,"nodes",5)) {
            ParseNodesSection(szCurrent,&szCurrent);
            continue;
        }
        // "triangles\n" - Starts the triangle section
        if (TokenMatch(szCurrent,"triangles",9)) {
            ParseTrianglesSection(szCurrent,&szCurrent);
            continue;
        }
        // "vertexanimation\n" - Starts the vertex animation section
        if (TokenMatch(szCurrent,"vertexanimation",15)) {
            bHasUVs = false;
            ParseVASection(szCurrent,&szCurrent);
            continue;
        }
        // "skeleton\n" - Starts the skeleton section
        if (TokenMatch(szCurrent,"skeleton",8)) {
            ParseSkeletonSection(szCurrent,&szCurrent);
            continue;
        }
        SkipLine(szCurrent,&szCurrent);
    }
}